

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O0

void __thiscall QLoggingRegistry::setApiRules(QLoggingRegistry *this,QString *content)

{
  long lVar1;
  QStringView content_00;
  undefined1 uVar2;
  QLoggingSettingsParser *in_RDI;
  long in_FS_OFFSET;
  QLoggingSettingsParser parser;
  QMutexLocker<QMutex> locker;
  QLoggingSettingsParser *in_stack_ffffffffffffff38;
  QMutexLocker<QMutex> *in_stack_ffffffffffffff40;
  QMutexLocker<QMutex> *this_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QMutexLocker<QMutex> local_80;
  QMessageLogger local_68;
  qsizetype in_stack_ffffffffffffffc0;
  storage_type_conflict *psVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QLoggingSettingsParser::QLoggingSettingsParser((QLoggingSettingsParser *)0x2d5a40);
  QLoggingSettingsParser::setImplicitRulesSection
            ((QLoggingSettingsParser *)&stack0xffffffffffffffc8,true);
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_RDI,
             (QString *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  content_00.m_data = psVar3;
  content_00.m_size = in_stack_ffffffffffffffc0;
  QLoggingSettingsParser::setContent(in_RDI,content_00);
  uVar2 = qtLoggingDebug();
  if ((bool)uVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff48),
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               &in_stack_ffffffffffffff38->m_inRulesSection,(char *)0x2d5aaf);
    QMessageLogger::debug
              (&local_68,"Loading logging rules set by QLoggingCategory::setFilterRules ...");
  }
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffff40,(QMutex *)in_stack_ffffffffffffff38);
  QLoggingSettingsParser::rules(in_stack_ffffffffffffff38);
  this_00 = &local_80;
  QList<QLoggingRule>::operator=
            ((QList<QLoggingRule> *)this_00,(QList<QLoggingRule> *)in_stack_ffffffffffffff38);
  QList<QLoggingRule>::~QList((QList<QLoggingRule> *)0x2d5b36);
  updateRules((QLoggingRegistry *)CONCAT17(uVar2,in_stack_ffffffffffffff48));
  QMutexLocker<QMutex>::~QMutexLocker(this_00);
  QLoggingSettingsParser::~QLoggingSettingsParser((QLoggingSettingsParser *)0x2d5b5c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLoggingRegistry::setApiRules(const QString &content)
{
    QLoggingSettingsParser parser;
    parser.setImplicitRulesSection(true);
    parser.setContent(content);

    if (qtLoggingDebug())
        debugMsg("Loading logging rules set by QLoggingCategory::setFilterRules ...");

    const QMutexLocker locker(&registryMutex);

    ruleSets[ApiRules] = parser.rules();

    updateRules();
}